

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::RecursiveGroup::~RecursiveGroup(RecursiveGroup *this)

{
  ~RecursiveGroup(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

RecursiveGroup::~RecursiveGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.RecursiveGroup)
  SharedDtor(*this);
}